

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

Type __thiscall
wasm::TypeBuilder::getTempRefType(TypeBuilder *this,HeapType type,Nullability nullable)

{
  type_t type_00;
  TypeInfo local_30;
  
  local_30.isTemp = false;
  local_30.kind = RefKind;
  local_30.field_2.ref.heapType.id = (HeapType)type.id;
  local_30.field_2.ref.nullable = nullable;
  type_00 = anon_unknown_0::Store<wasm::(anonymous_namespace)::TypeInfo>::insert
                      (&((this->impl)._M_t.
                         super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                         .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl)->
                        typeStore,&local_30);
  anon_unknown_0::markTemp((Type)type_00.id);
  anon_unknown_0::TypeInfo::~TypeInfo(&local_30);
  return (Type)type_00.id;
}

Assistant:

Type TypeBuilder::getTempRefType(HeapType type, Nullability nullable) {
  return markTemp(impl->typeStore.insert(TypeInfo(type, nullable)));
}